

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

ResourceVariableMeta __thiscall
dxil_spv::Converter::Impl::get_resource_variable_meta(Impl *this,MDNode *resource)

{
  ushort uVar1;
  uint uVar2;
  MDOperand *md;
  ConstantAsMetadata *this_00;
  Constant *value;
  ConstantExpr *this_01;
  size_type sVar3;
  ushort uVar4;
  GlobalVariable *local_28;
  
  if (resource == (MDNode *)0x0) {
    uVar4 = 0;
  }
  else {
    md = LLVMBC::MDNode::getOperand(resource,1);
    this_00 = LLVMBC::dyn_cast<LLVMBC::ConstantAsMetadata>(md);
    uVar4 = 0x100;
    if (this_00 != (ConstantAsMetadata *)0x0) {
      value = LLVMBC::ConstantAsMetadata::getValue(this_00);
      do {
        local_28 = LLVMBC::dyn_cast<LLVMBC::GlobalVariable>(&value->super_Value);
        do {
          do {
            if ((local_28 != (GlobalVariable *)0x0) || (value == (Constant *)0x0)) {
              if (local_28 == (GlobalVariable *)0x0) goto LAB_0010ec2c;
              sVar3 = std::
                      _Hashtable<const_LLVMBC::GlobalVariable_*,_const_LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GlobalVariable_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GlobalVariable_*>,_std::hash<const_LLVMBC::GlobalVariable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::count(&(this->llvm_active_global_resource_variables)._M_h,&local_28);
              uVar4 = (ushort)(sVar3 != 0) << 8;
              uVar1 = 1;
              goto LAB_0010ec2e;
            }
            this_01 = LLVMBC::dyn_cast<LLVMBC::ConstantExpr>(&value->super_Value);
            local_28 = (GlobalVariable *)0x0;
            value = (Constant *)0x0;
          } while (this_01 == (ConstantExpr *)0x0);
          uVar2 = LLVMBC::ConstantExpr::getOpcode(this_01);
          local_28 = (GlobalVariable *)0x0;
          value = (Constant *)0x0;
        } while (uVar2 != 0x70);
        value = LLVMBC::ConstantExpr::getOperand(this_01,0);
      } while( true );
    }
  }
LAB_0010ec2c:
  uVar1 = 0;
LAB_0010ec2e:
  return (ResourceVariableMeta)(uVar1 | uVar4);
}

Assistant:

Converter::Impl::ResourceVariableMeta Converter::Impl::get_resource_variable_meta(const llvm::MDNode *resource) const
{
	ResourceVariableMeta meta = {};

	if (!resource)
		return meta;

	if (const auto *variable = llvm::dyn_cast<llvm::ConstantAsMetadata>(resource->getOperand(1)))
	{
		const llvm::Value *val = variable->getValue();
		const auto *global = llvm::dyn_cast<llvm::GlobalVariable>(val);

		// It's possible that the variable is a constexpr bitcast, so resolve those ...
		while (!global && val)
		{
			auto *constexpr_op = llvm::dyn_cast<llvm::ConstantExpr>(val);
			val = nullptr;

			if (constexpr_op && constexpr_op->getOpcode() == llvm::UnaryOperator::BitCast)
			{
				val = constexpr_op->getOperand(0);
				global = llvm::dyn_cast<llvm::GlobalVariable>(val);
			}
		}

		if (global)
		{
			meta.is_lib_variable = true;
			meta.is_active = llvm_active_global_resource_variables.count(global) != 0;
			return meta;
		}
	}

	meta.is_active = true;
	return meta;
}